

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

Token * __thiscall wabt::WastLexer::GetInfToken(Token *__return_storage_ptr__,WastLexer *this)

{
  bool bVar1;
  string_view local_20;
  WastLexer *local_10;
  WastLexer *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"inf");
  bVar1 = MatchString(this,local_20);
  if (bVar1) {
    bVar1 = NoTrailingReservedChars(this);
    if (bVar1) {
      LiteralToken(__return_storage_ptr__,this,First_Literal,Infinity);
    }
    else {
      GetReservedToken(__return_storage_ptr__,this);
    }
  }
  else {
    GetKeywordToken(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetInfToken() {
  if (MatchString("inf")) {
    if (NoTrailingReservedChars()) {
      return LiteralToken(TokenType::Float, LiteralType::Infinity);
    }
    return GetReservedToken();
  }
  return GetKeywordToken();
}